

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal
                 (ZSTD_compressionParameters *cParams,ldmParams_t *ldmParams,int isStatic,
                 ZSTD_paramSwitch_e useRowMatchFinder,size_t buffInSize,size_t buffOutSize,
                 U64 pledgedSrcSize,int useSequenceProducer,size_t maxBlockSize)

{
  uint uVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  uVar8 = 1L << ((byte)cParams->windowLog & 0x3f);
  if (pledgedSrcSize <= uVar8) {
    uVar8 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar8 = 1;
  }
  uVar11 = 0x20000;
  if (maxBlockSize != 0) {
    uVar11 = maxBlockSize;
  }
  if (uVar8 <= uVar11) {
    uVar11 = uVar8;
  }
  uVar1 = cParams->minMatch;
  uVar8 = 0;
  sVar4 = ZSTD_sizeof_matchState(cParams,useRowMatchFinder,0,1);
  if (ldmParams->enableLdm == ZSTD_ps_enable) {
    bVar3 = (byte)ldmParams->hashLog;
    bVar6 = bVar3 - (char)ldmParams->bucketSizeLog;
    if (ldmParams->hashLog < ldmParams->bucketSizeLog) {
      bVar6 = 0;
    }
    lVar9 = (8L << (bVar3 & 0x3f)) + (1L << (bVar6 & 0x3f));
    uVar8 = (uVar11 / ldmParams->minMatchLength) * 0xc + 0x3f & 0xffffffffffffffc0;
  }
  else {
    lVar9 = 0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  uVar7 = (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 8 + 0x4f &
          0xffffffffffffffc0;
  if (useSequenceProducer == 0) {
    uVar7 = 0;
  }
  uVar5 = uVar11 / (4 - (ulong)(useSequenceProducer != 0 || uVar1 == 3));
  lVar10 = buffInSize + 0x4ed8;
  if (isStatic != 0) {
    lVar10 = buffInSize + 0x6350;
  }
  return (uVar5 * 8 + 0x3f & 0xffffffffffffffc0) +
         buffOutSize + sVar4 + lVar10 + uVar11 + uVar8 + lVar9 + uVar7 + uVar5 * 3 + 0x20;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        const ZSTD_compressionParameters* cParams,
        const ldmParams_t* ldmParams,
        const int isStatic,
        const ZSTD_paramSwitch_e useRowMatchFinder,
        const size_t buffInSize,
        const size_t buffOutSize,
        const U64 pledgedSrcSize,
        int useSequenceProducer,
        size_t maxBlockSize)
{
    size_t const windowSize = (size_t) BOUNDED(1ULL, 1ULL << cParams->windowLog, pledgedSrcSize);
    size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(maxBlockSize), windowSize);
    size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, cParams->minMatch, useSequenceProducer);
    size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                            + ZSTD_cwksp_aligned_alloc_size(maxNbSeq * sizeof(seqDef))
                            + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
    size_t const entropySpace = ZSTD_cwksp_alloc_size(ENTROPY_WORKSPACE_SIZE);
    size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
    size_t const matchStateSize = ZSTD_sizeof_matchState(cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 0, /* forCCtx */ 1);

    size_t const ldmSpace = ZSTD_ldm_getTableSize(*ldmParams);
    size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(*ldmParams, blockSize);
    size_t const ldmSeqSpace = ldmParams->enableLdm == ZSTD_ps_enable ?
        ZSTD_cwksp_aligned_alloc_size(maxNbLdmSeq * sizeof(rawSeq)) : 0;


    size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize)
                             + ZSTD_cwksp_alloc_size(buffOutSize);

    size_t const cctxSpace = isStatic ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;

    size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
    size_t const externalSeqSpace = useSequenceProducer
        ? ZSTD_cwksp_aligned_alloc_size(maxNbExternalSeq * sizeof(ZSTD_Sequence))
        : 0;

    size_t const neededSpace =
        cctxSpace +
        entropySpace +
        blockStateSpace +
        ldmSpace +
        ldmSeqSpace +
        matchStateSize +
        tokenSpace +
        bufferSpace +
        externalSeqSpace;

    DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
    return neededSpace;
}